

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O0

bool __thiscall depspawn::internal::TaskPool::try_run(TaskPool *this)

{
  bool bVar1;
  TaskPool *in_RDI;
  bool ret;
  Task *p;
  Task *in_stack_ffffffffffffffd8;
  undefined1 local_12;
  
  bVar1 = boost::lockfree::
          queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::pop
                    ((queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
                      *)in_RDI,(Task **)in_stack_ffffffffffffffd8);
  local_12 = true;
  if (!bVar1) {
    local_12 = boost::lockfree::
               queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::pop
                         ((queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
                           *)in_RDI,(Task **)in_stack_ffffffffffffffd8);
  }
  if (local_12 != false) {
    run(in_RDI,in_stack_ffffffffffffffd8);
  }
  return local_12;
}

Assistant:

bool try_run()
  { Task *p;

    const bool ret = hp_queue_.pop(p) || queue_.pop(p);
    if (ret) {
      run(p);
    }

    return ret;
  }